

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O0

id __thiscall
jessilib::impl::parser_manager::register_parser
          (parser_manager *this,shared_ptr<jessilib::parser> *in_parser,string *in_format,
          bool in_force)

{
  bool bVar1;
  parser_manager *local_a0;
  id parser_id;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
  local_70;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
  local_68;
  undefined4 local_5c;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
  local_58 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
  local_40;
  iterator itr;
  lock_guard<std::shared_mutex> guard;
  bool in_force_local;
  string *in_format_local;
  shared_ptr<jessilib::parser> *in_parser_local;
  parser_manager *this_local;
  
  std::lock_guard<std::shared_mutex>::lock_guard
            ((lock_guard<std::shared_mutex> *)&itr,&this->m_mutex);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
       ::find(&this->m_parsers,in_format);
  local_58[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
       ::end(&this->m_parsers);
  bVar1 = std::__detail::operator==(&local_40,local_58);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    if (!in_force) {
      this_local = (parser_manager *)0x0;
      goto LAB_002368e8;
    }
    local_68._M_cur = local_40._M_cur;
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
         ::erase(&this->m_parsers,local_40._M_cur);
    registration::registration((registration *)&parser_id,in_format);
    std::
    set<jessilib::impl::parser_manager::registration,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
    ::erase(&this->m_registrations,(key_type *)&parser_id);
    registration::~registration((registration *)&parser_id);
  }
  local_a0 = (parser_manager *)(this->m_last_id + 1);
  this->m_last_id = (id)local_a0;
  std::
  unordered_map<std::__cxx11::string,std::shared_ptr<jessilib::parser>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<jessilib::parser>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<jessilib::parser>&>
            ((unordered_map<std::__cxx11::string,std::shared_ptr<jessilib::parser>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<jessilib::parser>>>>
              *)&this->m_parsers,in_format,in_parser);
  std::
  set<jessilib::impl::parser_manager::registration,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
  ::emplace<unsigned_long&,std::__cxx11::string_const&>
            ((set<jessilib::impl::parser_manager::registration,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
              *)&this->m_registrations,(unsigned_long *)&local_a0,in_format);
  this_local = local_a0;
LAB_002368e8:
  local_5c = 1;
  std::lock_guard<std::shared_mutex>::~lock_guard((lock_guard<std::shared_mutex> *)&itr);
  return (id)this_local;
}

Assistant:

parser_manager::id parser_manager::register_parser(std::shared_ptr<parser> in_parser, const std::string& in_format, bool in_force) {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Check for any existing parser
	auto itr = m_parsers.find(in_format);
	if (itr != m_parsers.end()) {
		// A parser already exists; return or replace
		if (!in_force) {
			return bad_id;
		}

		// Remove existing parser and registration
		m_parsers.erase(itr);
		m_registrations.erase(registration{ in_format });
	}

	// Register our new parser
	id parser_id = ++m_last_id;
	m_parsers.emplace(in_format, in_parser);
	m_registrations.emplace(parser_id, in_format);

	// Our parser is registered; return the parser ID we just registered
	return parser_id;
}